

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_cast_bool_test.cpp
# Opt level: O0

void __thiscall
reflect_value_cast_bool_test_bool_to_bool_cast_Test::TestBody
          (reflect_value_cast_bool_test_bool_to_bool_cast_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  uchar b;
  value v;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  AssertHelper in_stack_ffffffffffffffb0;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_ffffffffffffffb8;
  AssertionResult local_28;
  undefined1 local_11;
  undefined8 local_10;
  
  local_10 = value_create_bool(1);
  local_11 = value_to_bool(local_10);
  local_10 = value_type_cast(local_10,0);
  value_to_bool(local_10);
  this_00 = &local_28;
  testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
            ((char *)in_stack_ffffffffffffffb8._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,(char *)in_stack_ffffffffffffffb0.data_,
             (uchar *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
             &this_00->success_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffffb8);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x115aec);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_value_cast_test/source/reflect_value_cast_bool_test.cpp"
               ,0x27,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&stack0xffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
    testing::Message::~Message((Message *)0x115b38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x115b78);
  value_destroy(local_10);
  return;
}

Assistant:

TEST_F(reflect_value_cast_bool_test, bool_to_bool_cast)
{
	value v = value_create_bool(1L);

	boolean b = value_to_bool(v);

	v = value_type_cast(v, TYPE_BOOL);

	EXPECT_EQ((boolean)b, (boolean)value_to_bool(v));

	value_destroy(v);
}